

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void reset_dec_workers(AV1Decoder *pbi,AVxWorkerHook worker_hook,int num_workers)

{
  DecWorkerData *pDVar1;
  ThreadData *pTVar2;
  int j;
  AVxWorkerInterface *pAVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  AVxWorker *pAVar7;
  
  pAVar3 = aom_get_worker_interface();
  uVar6 = 0;
  uVar5 = (ulong)(uint)num_workers;
  if (num_workers < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pAVar7 = pbi->tile_workers + uVar6;
    pDVar1 = pbi->thread_data;
    memcpy(pDVar1[uVar6].td,pbi,0x3b60);
    pTVar2 = pDVar1[uVar6].td;
    (pTVar2->dcb).corrupted = 0;
    (pTVar2->dcb).mc_buf[0] = pTVar2->mc_buf[0];
    ((pDVar1[uVar6].td)->dcb).mc_buf[1] = (pDVar1[uVar6].td)->mc_buf[1];
    pTVar2 = pDVar1[uVar6].td;
    (pTVar2->dcb).xd.tmp_conv_dst = pTVar2->tmp_conv_dst;
    if (uVar6 != 0) {
      (pTVar2->dcb).xd.seg_mask = pTVar2->seg_mask;
    }
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      pTVar2 = pDVar1[uVar6].td;
      (pTVar2->dcb).xd.tmp_obmc_bufs[lVar4] = pTVar2->tmp_obmc_bufs[lVar4];
    }
    (*pAVar3->sync)(pAVar7);
    pAVar7->hook = worker_hook;
    pAVar7->data1 = pDVar1 + uVar6;
    pAVar7->data2 = pbi;
  }
  return;
}

Assistant:

static inline void reset_dec_workers(AV1Decoder *pbi, AVxWorkerHook worker_hook,
                                     int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  // Reset tile decoding hook
  for (int worker_idx = 0; worker_idx < num_workers; ++worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx];
    DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
    thread_data->td->dcb = pbi->dcb;
    thread_data->td->dcb.corrupted = 0;
    thread_data->td->dcb.mc_buf[0] = thread_data->td->mc_buf[0];
    thread_data->td->dcb.mc_buf[1] = thread_data->td->mc_buf[1];
    thread_data->td->dcb.xd.tmp_conv_dst = thread_data->td->tmp_conv_dst;
    if (worker_idx)
      thread_data->td->dcb.xd.seg_mask = thread_data->td->seg_mask;
    for (int j = 0; j < 2; ++j) {
      thread_data->td->dcb.xd.tmp_obmc_bufs[j] =
          thread_data->td->tmp_obmc_bufs[j];
    }
    winterface->sync(worker);

    worker->hook = worker_hook;
    worker->data1 = thread_data;
    worker->data2 = pbi;
  }
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    aom_accounting_reset(&pbi->accounting);
  }
#endif
}